

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O0

bool __thiscall
cmExtraSublimeTextGenerator::Open
          (cmExtraSublimeTextGenerator *this,string *bindir,string *projectName,bool dryRun)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  cmake *this_00;
  string *psVar2;
  duration<double,_std::ratio<1L,_1L>_> timeout;
  string_view val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_17b;
  undefined1 local_17a;
  allocator<char> local_179;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string local_150 [32];
  string local_130 [32];
  iterator local_110;
  size_type local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_100;
  undefined4 local_e4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [8];
  string filename;
  allocator<char> local_59;
  string local_58;
  cmValue local_38;
  cmValue sublExecutable;
  bool dryRun_local;
  string *projectName_local;
  string *bindir_local;
  cmExtraSublimeTextGenerator *this_local;
  
  sublExecutable.Value._7_1_ = dryRun;
  this_00 = cmGlobalGenerator::GetCMakeInstance
                      ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"CMAKE_SUBLIMETEXT_EXECUTABLE",&local_59);
  local_38 = cmake::GetCacheDefinition(this_00,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  bVar1 = cmValue::operator_cast_to_bool(&local_38);
  if (bVar1) {
    psVar2 = cmValue::operator*[abi_cxx11_(&local_38);
    val = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar2);
    filename.field_2._8_8_ = val._M_len;
    bVar1 = cmIsNOTFOUND(val);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      std::operator+(&local_e0,bindir,"/");
      std::operator+(&local_c0,&local_e0,projectName);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                     &local_c0,".sublime-project");
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_e0);
      if ((sublExecutable.Value._7_1_ & 1) == 0) {
        local_17a = 1;
        local_178 = &local_170;
        psVar2 = cmValue::operator*[abi_cxx11_(&local_38);
        std::__cxx11::string::string((string *)&local_170,(string *)psVar2);
        local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_150,"--project",&local_179);
        local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130;
        std::__cxx11::string::string((string *)local_178,(string *)local_a0);
        local_17a = 0;
        local_110 = &local_170;
        local_108 = 3;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator(&local_17b);
        __l._M_len = local_108;
        __l._M_array = local_110;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_100,__l,&local_17b);
        timeout = std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
        this_local._7_1_ =
             cmSystemTools::RunSingleCommand
                       (&local_100,(string *)0x0,(string *)0x0,(int *)0x0,(char *)0x0,OUTPUT_MERGE,
                        (cmDuration)timeout.__r,Auto);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_100);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator(&local_17b);
        local_1e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_110;
        do {
          local_1e0 = local_1e0 + -1;
          std::__cxx11::string::~string((string *)local_1e0);
        } while (local_1e0 != &local_170);
        std::allocator<char>::~allocator(&local_179);
      }
      else {
        this_local._7_1_ = cmsys::SystemTools::FileExists((string *)local_a0,true);
      }
      local_e4 = 1;
      std::__cxx11::string::~string((string *)local_a0);
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmExtraSublimeTextGenerator::Open(const std::string& bindir,
                                       const std::string& projectName,
                                       bool dryRun)
{
  cmValue sublExecutable =
    this->GlobalGenerator->GetCMakeInstance()->GetCacheDefinition(
      "CMAKE_SUBLIMETEXT_EXECUTABLE");
  if (!sublExecutable) {
    return false;
  }
  if (cmIsNOTFOUND(*sublExecutable)) {
    return false;
  }

  std::string filename = bindir + "/" + projectName + ".sublime-project";
  if (dryRun) {
    return cmSystemTools::FileExists(filename, true);
  }

  return cmSystemTools::RunSingleCommand(
    { *sublExecutable, "--project", filename });
}